

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O2

Am_Value_List __thiscall Am_Value_List::Recursive_Copy(Am_Value_List *this)

{
  uint *puVar1;
  Am_Value_List_Data *proto;
  Am_Wrapper *list_value;
  Am_Value_List_Data *this_00;
  Am_List_Item *extraout_RDX;
  Am_List_Item *extraout_RDX_00;
  Am_List_Item *pAVar2;
  Am_List_Item *extraout_RDX_01;
  undefined8 *in_RSI;
  anon_union_8_8_ea4c8939_for_value *paVar3;
  Am_Value_List AVar4;
  Am_Value v;
  Am_Value_List this_list;
  
  proto = (Am_Value_List_Data *)*in_RSI;
  if (proto == (Am_Value_List_Data *)0x0) {
    Am_Value_List(this,&Am_No_Value_List);
    pAVar2 = extraout_RDX_01;
  }
  else {
    this_00 = (Am_Value_List_Data *)operator_new(0x20);
    Am_Value_List_Data::Am_Value_List_Data(this_00,proto);
    paVar3 = (anon_union_8_8_ea4c8939_for_value *)&this_00->head;
    pAVar2 = extraout_RDX;
    while (list_value = paVar3->wrapper_value, list_value != (Am_Wrapper *)0x0) {
      if (*(Am_Value_Type *)&list_value->super_Am_Registered_Type == Am_Value_List_Data::id) {
        Am_Value_List(&this_list,(Am_Value *)list_value);
        Recursive_Copy((Am_Value_List *)&v);
        operator=(&this_list,(Am_Value_List *)&v);
        ~Am_Value_List((Am_Value_List *)&v);
        v.type = 0;
        v.value.wrapper_value = (Am_Wrapper *)0x0;
        if (this_list.data != (Am_Value_List_Data *)0x0) {
          puVar1 = &((this_list.data)->super_Am_Wrapper).refs;
          *puVar1 = *puVar1 + 1;
        }
        Am_Value::operator=(&v,&(this_list.data)->super_Am_Wrapper);
        Am_Value::operator=((Am_Value *)list_value,&v);
        Am_Value::~Am_Value(&v);
        ~Am_Value_List(&this_list);
        pAVar2 = extraout_RDX_00;
      }
      paVar3 = &((Am_Value *)(list_value + 1))->value;
    }
    this->data = this_00;
  }
  AVar4.item = pAVar2;
  AVar4.data = (Am_Value_List_Data *)this;
  return AVar4;
}

Assistant:

Am_Value_List
Am_Value_List::Recursive_Copy()
{
  if (data) {
    Am_Value_List_Data *new_data = new Am_Value_List_Data(data);
    Am_List_Item *this_item = new_data->head;
    while (this_item) {
      if (this_item->type == Am_Value_List::Type_ID()) {
        Am_Value_List this_list = (*this_item);
        this_list = this_list.Recursive_Copy();
        Am_Value v;
        v = this_list;
        *this_item = v;
      }
      this_item = this_item->next;
    }
    return Am_Value_List(new_data);
  } else
    return Am_No_Value_List;
}